

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeAttributesEncoderIdentifier
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          int32_t att_encoder_id)

{
  MeshTraversalMethod MVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  MeshTraversalMethod *pMVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  pointer pcVar7;
  EncoderBuffer *pEVar8;
  int8_t att_data_id;
  char local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  local_1c = (char)(this->attribute_encoder_to_data_id_map_).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[att_encoder_id];
  pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
  if (pEVar8->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar8,
               (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_1c,&local_1b);
  }
  if ((long)local_1c < 0) {
    pMVar4 = &this->pos_traversal_method_;
    iVar3 = 0;
  }
  else {
    iVar3 = (this->attribute_data_).
            super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1c].attribute_index;
    iVar2 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
              _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
    iVar3 = *(int *)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x70) + 0xa8) +
                    (long)iVar3 * 4);
    pMVar4 = &(this->attribute_data_).
              super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
              ._M_impl.super__Vector_impl_data._M_start[local_1c].traversal_method;
  }
  MVar1 = *pMVar4;
  if ((iVar3 == 0) ||
     ((iVar3 == 1 &&
      ((this->attribute_data_).
       super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
       ._M_impl.super__Vector_impl_data._M_start[local_1c].connectivity_data.no_interior_seams_ ==
       true)))) {
    pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
    local_19 = 0;
    if (0 < pEVar8->bit_encoder_reserved_bytes_) goto LAB_0013d8df;
    pcVar7 = (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = &stack0xffffffffffffffe8;
    puVar6 = &local_19;
  }
  else {
    pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
    local_1a = 1;
    if (0 < pEVar8->bit_encoder_reserved_bytes_) goto LAB_0013d8df;
    pcVar7 = (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = &local_19;
    puVar6 = &local_1a;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
            ((vector<char,std::allocator<char>> *)pEVar8,pcVar7,puVar6,puVar5);
LAB_0013d8df:
  pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
  local_1b = (undefined1)MVar1;
  if (pEVar8->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar8,
               (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_1b,&local_1a);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::
    EncodeAttributesEncoderIdentifier(int32_t att_encoder_id) {
  const int8_t att_data_id = attribute_encoder_to_data_id_map_[att_encoder_id];
  encoder_->buffer()->Encode(att_data_id);

  // Also encode the type of the encoder that we used.
  int32_t element_type = MESH_VERTEX_ATTRIBUTE;
  MeshTraversalMethod traversal_method;
  if (att_data_id >= 0) {
    const int32_t att_id = attribute_data_[att_data_id].attribute_index;
    element_type = GetEncoder()->mesh()->GetAttributeElementType(att_id);
    traversal_method = attribute_data_[att_data_id].traversal_method;
  } else {
    traversal_method = pos_traversal_method_;
  }
  if (element_type == MESH_VERTEX_ATTRIBUTE ||
      (element_type == MESH_CORNER_ATTRIBUTE &&
       attribute_data_[att_data_id].connectivity_data.no_interior_seams())) {
    // Per-vertex encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_VERTEX_ATTRIBUTE));
  } else {
    // Per-corner encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_CORNER_ATTRIBUTE));
  }
  // Encode the mesh traversal method.
  encoder_->buffer()->Encode(static_cast<uint8_t>(traversal_method));
  return true;
}